

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

void __thiscall wallet::CKeyPool::Serialize<DataStream>(CKeyPool *this,DataStream *s)

{
  long lVar1;
  DataStream *pDVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<DataStream>(s,0x3f73c);
  pDVar2 = DataStream::operator<<(s,&this->nTime);
  CPubKey::Serialize<DataStream>(&this->vchPubKey,pDVar2);
  pDVar2 = DataStream::operator<<(pDVar2,&this->fInternal);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    DataStream::operator<<(pDVar2,&this->m_pre_split);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        s << int{259900}; // Unused field, writes the highest client version ever written
        s << nTime << vchPubKey << fInternal << m_pre_split;
    }